

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# names.cc
# Opt level: O1

string * __thiscall
upb::generator::(anonymous_namespace)::ToCIdent_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,string_view str)

{
  undefined8 local_68;
  char *local_60;
  undefined8 local_58;
  char *local_50;
  undefined8 local_48;
  char *local_40;
  undefined8 local_38;
  char *local_30;
  undefined8 local_28;
  char *local_20;
  undefined8 local_18;
  char *local_10;
  
  local_68 = 1;
  local_60 = ".";
  local_58 = 1;
  local_50 = "_";
  local_48 = 1;
  local_40 = "/";
  local_38 = 1;
  local_30 = "_";
  local_28 = 1;
  local_20 = "-";
  local_18 = 1;
  local_10 = "_";
  absl::lts_20240722::StrReplaceAll_abi_cxx11_(__return_storage_ptr__,this,str._M_len,&local_68,3);
  return __return_storage_ptr__;
}

Assistant:

std::string ToCIdent(absl::string_view str) {
  return absl::StrReplaceAll(str, {{".", "_"}, {"/", "_"}, {"-", "_"}});
}